

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O1

void __thiscall
nn::ESoinn::findMergedClasses
          (ESoinn *this,
          map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *node_axis,
          map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
          *mergeClasses)

{
  pointer *ppuVar1;
  double maxDensity;
  pointer pEVar2;
  ConcreteLogger *this_00;
  pointer puVar3;
  ulong uVar4;
  mapped_type *pmVar5;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *p_Var6;
  pointer pEVar7;
  undefined8 uVar8;
  pointer pEVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pEVar12;
  pointer pEVar13;
  ulong uVar14;
  ESoinn *pEVar15;
  pointer in_R8;
  undefined1 auVar16 [8];
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> neighbours;
  uint local_40;
  uint local_3c;
  uint32_t num;
  uint32_t A_axes;
  uint32_t B_axes;
  
  this_00 = log_netw;
  ppuVar1 = &neighbours.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_80 = (undefined1  [8])ppuVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"findMergedClasses function","");
  logger::ConcreteLogger::debug(this_00,(string *)local_80,false);
  if (local_80 != (undefined1  [8])ppuVar1) {
    operator_delete((void *)local_80);
  }
  A_axes = 0;
  pEVar9 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_Neurons).
      super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar9) {
    uVar4 = 0;
    do {
      if (pEVar9[uVar4].m_IsDeleted == false) {
        neuron::ESoinnNeuron::getNeighbours
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,pEVar9 + uVar4);
        puVar3 = neighbours.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (auVar16 = local_80; auVar16 != (undefined1  [8])puVar3;
            auVar16 = (undefined1  [8])((long)auVar16 + 4)) {
          local_40 = *(uint *)auVar16;
          uVar4 = (ulong)local_40;
          uVar10 = (ulong)A_axes;
          if (A_axes < local_40) {
            pEVar9 = (this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar11 = ((long)(this->m_Neurons).
                            super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar9 >> 3) *
                     -0xf0f0f0f0f0f0f0f;
            uVar14 = uVar10;
            if ((uVar11 < uVar10 || uVar11 - uVar10 == 0) ||
               (uVar14 = uVar4, uVar11 < uVar4 || uVar11 - uVar4 == 0)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar14);
LAB_00130a5a:
              __assert_fail("A_axes != B_axes",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/neural_network/ESoinn.cpp"
                            ,0x16e,
                            "void nn::ESoinn::findMergedClasses(const std::map<uint32_t, uint32_t> &, std::map<uint32_t, std::set<uint32_t>> &) const"
                           );
            }
            if (pEVar9[uVar10].m_CurClass == pEVar9[uVar4].m_CurClass) goto LAB_001309ff;
            pmVar5 = std::
                     map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::at(node_axis,&A_axes);
            local_3c = *pmVar5;
            pmVar5 = std::
                     map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     ::at(node_axis,&local_40);
            num = *pmVar5;
            pEVar7 = (pointer)(ulong)num;
            pEVar13 = (pointer)(ulong)local_3c;
            if (local_3c == num) goto LAB_00130a5a;
            pEVar2 = (this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pEVar12 = (pointer)(((long)(this->m_Neurons).
                                       super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >>
                                3) * -0xf0f0f0f0f0f0f0f);
            if (pEVar12 < pEVar13 || (long)pEVar12 - (long)pEVar13 == 0) {
              pEVar7 = (pointer)std::__throw_out_of_range_fmt
                                          (
                                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                          );
LAB_00130a87:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,pEVar7);
            }
            else {
              if (pEVar12 < pEVar7 || (long)pEVar12 - (long)pEVar7 == 0) goto LAB_00130a87;
              pEVar9 = (pointer)(ulong)A_axes;
              if (pEVar9 <= pEVar12 && (long)pEVar12 - (long)pEVar9 != 0) {
                in_R8 = (pointer)(ulong)local_40;
                if (pEVar12 < in_R8 || (long)pEVar12 - (long)in_R8 == 0) goto LAB_00130aa9;
                dVar19 = pEVar2[(long)pEVar13].m_Density;
                maxDensity = pEVar2[(long)pEVar7].m_Density;
                dVar17 = pEVar2[(long)in_R8].m_Density;
                if (pEVar2[(long)pEVar9].m_Density <= pEVar2[(long)in_R8].m_Density) {
                  dVar17 = pEVar2[(long)pEVar9].m_Density;
                }
                pEVar15 = this;
                dVar18 = meanDensity(this,local_3c);
                dVar18 = getAlpha(pEVar15,dVar19,dVar18);
                if (dVar17 <= dVar19 * dVar18) {
                  pEVar15 = this;
                  dVar19 = meanDensity(this,num);
                  dVar19 = getAlpha(pEVar15,maxDensity,dVar19);
                  if (dVar17 <= maxDensity * dVar19) goto LAB_001309ff;
                }
                p_Var6 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)std::
                            map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                            ::operator[](mergeClasses,&local_3c);
                std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_emplace_unique<unsigned_int_const&>(p_Var6,&num);
                p_Var6 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                          *)std::
                            map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                            ::operator[](mergeClasses,&num);
                std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_emplace_unique<unsigned_int_const&>(p_Var6,&local_3c);
                goto LAB_001309ff;
              }
            }
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       pEVar9);
LAB_00130aa9:
            uVar8 = std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,in_R8);
            if (local_80 != (undefined1  [8])0xf0f0f0f0f0f0f0f1) {
              operator_delete((void *)local_80);
            }
            _Unwind_Resume(uVar8);
          }
LAB_001309ff:
        }
        if (local_80 != (undefined1  [8])0x0) {
          operator_delete((void *)local_80);
        }
      }
      A_axes = A_axes + 1;
      uVar4 = (ulong)A_axes;
      pEVar9 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar10 = ((long)(this->m_Neurons).
                      super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar9 >> 3) *
               -0xf0f0f0f0f0f0f0f;
    } while (uVar4 <= uVar10 && uVar10 - uVar4 != 0);
  }
  return;
}

Assistant:

void ESoinn::findMergedClasses(const std::map<uint32_t, uint32_t>& node_axis, std::map<uint32_t, std::set<uint32_t>>& mergeClasses) const
    {
        log_netw->debug("findMergedClasses function");
        //iterate all edges
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            std::vector<uint32_t> neighbours = m_Neurons.at(i).getNeighbours();
            for (uint32_t num: neighbours)
            {
                if (num <= i)
                    continue;
                
                if (m_Neurons.at(i).curClass() != m_Neurons.at(num).curClass())
                {
                    const uint32_t A_axes = node_axis.at(i);
                    const uint32_t B_axes = node_axis.at(num);
                    assert(A_axes != B_axes);
                        
                    const double Amax = m_Neurons.at(A_axes).density();
                    const double Bmax = m_Neurons.at(B_axes).density();
                    const double min_density = std::min(m_Neurons.at(i).density(), m_Neurons.at(num).density());
                    if (min_density > getAlpha(Amax, meanDensity(A_axes)) * Amax ||
                        min_density > getAlpha(Bmax, meanDensity(B_axes)) * Bmax)
                    {
                        //Add two classes as need to merge 
                        mergeClasses[A_axes].emplace(B_axes);
                        mergeClasses[B_axes].emplace(A_axes);
                    }
                }
            }
        }
    }